

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O3

void prsglval(prscxdef *ctx,int typ,prsndef *n)

{
  ushort *puVar1;
  uchar uVar2;
  ushort uVar3;
  undefined2 uVar4;
  emtcxdef *peVar5;
  prsndef *n_00;
  bool bVar6;
  uchar uVar7;
  byte bVar8;
  uint16_t tmp;
  ushort uVar9;
  byte bVar10;
  
  while( true ) {
    if (typ - 0x96U < 9) {
      bVar10 = "4\x148\x18\x04\b\x10\f"[typ - 0x96U] | 0xc0;
      uVar7 = '\0';
    }
    else {
      uVar7 = *(uchar *)((long)&UINT_0013a2d0 + (long)typ + 1);
      bVar10 = 0xdc;
    }
    if (n->prsnnlf != 2) break;
    if (n->prsntyp != 0x3a) {
      if (n->prsntyp != 0x40) {
LAB_0011f85d:
        errlogf(ctx->prscxerr,"TADS",0x139);
        return;
      }
      n_00 = (n->prsnv).prsnvn[1];
      prsgexp(ctx,(n->prsnv).prsnvn[0]);
      if ((n_00->prsnnlf == 0) && ((n_00->prsnv).prsnvt.toktyp == 0x55)) {
        uVar9 = (n_00->prsnv).prsnvt.tokofs;
        bVar8 = 1;
        bVar6 = false;
      }
      else {
        prsgexp(ctx,n_00);
        bVar6 = true;
        bVar8 = 3;
        uVar9 = 0;
      }
      emtres(ctx->prscxemt,1);
      peVar5 = ctx->prscxemt;
      uVar3 = peVar5->emtcxofs;
      peVar5->emtcxofs = uVar3 + 1;
      peVar5->emtcxptr[uVar3] = bVar8 | bVar10;
      if (uVar7 != '\0') {
        emtres(ctx->prscxemt,1);
        peVar5 = ctx->prscxemt;
        uVar3 = peVar5->emtcxofs;
        peVar5->emtcxofs = uVar3 + 1;
        peVar5->emtcxptr[uVar3] = uVar7;
      }
      if (!bVar6) {
        emtres(ctx->prscxemt,2);
        *(ushort *)(ctx->prscxemt->emtcxptr + ctx->prscxemt->emtcxofs) = uVar9;
LAB_0011f9d5:
        puVar1 = &ctx->prscxemt->emtcxofs;
        *puVar1 = *puVar1 + 2;
      }
      return;
    }
    prsgexp(ctx,(n->prsnv).prsnvn[0]);
    prsgexp(ctx,(n->prsnv).prsnvn[1]);
    emtres(ctx->prscxemt,1);
    peVar5 = ctx->prscxemt;
    uVar3 = peVar5->emtcxofs;
    peVar5->emtcxofs = uVar3 + 1;
    peVar5->emtcxptr[uVar3] = bVar10 | 2;
    if (uVar7 != '\0') {
      emtres(ctx->prscxemt,1);
      peVar5 = ctx->prscxemt;
      uVar3 = peVar5->emtcxofs;
      peVar5->emtcxofs = uVar3 + 1;
      peVar5->emtcxptr[uVar3] = uVar7;
    }
    n = (n->prsnv).prsnvn[0];
    typ = 0x9e;
  }
  if ((n->prsnnlf != 0) || ((n->prsnv).prsnvt.toktyp != 0x38)) goto LAB_0011f85d;
  if ((ctx->prscxflg & 0x20) != 0) {
    errsigf(ctx->prscxerr,"TADS",0x7dc);
  }
  uVar2 = (n->prsnv).prsnvt.toksym.tokstyp;
  if (uVar2 == '\x03') {
    if ((ctx->prscxflg & 0x40) != 0) {
      errlogf(ctx->prscxerr,"TADS",0x158);
    }
    emtres(ctx->prscxemt,1);
    peVar5 = ctx->prscxemt;
    uVar3 = peVar5->emtcxofs;
    peVar5->emtcxofs = uVar3 + 1;
    peVar5->emtcxptr[uVar3] = '\x1c';
    emtres(ctx->prscxemt,1);
    bVar10 = bVar10 | 1;
  }
  else {
    if (uVar2 != '\x04') {
      if (uVar2 == '\x0e') {
        errsigf(ctx->prscxerr,"TADS",0x167);
      }
      goto LAB_0011f85d;
    }
    emtres(ctx->prscxemt,1);
  }
  peVar5 = ctx->prscxemt;
  uVar3 = peVar5->emtcxofs;
  peVar5->emtcxofs = uVar3 + 1;
  peVar5->emtcxptr[uVar3] = bVar10;
  if (uVar7 != '\0') {
    emtres(ctx->prscxemt,1);
    peVar5 = ctx->prscxemt;
    uVar3 = peVar5->emtcxofs;
    peVar5->emtcxofs = uVar3 + 1;
    peVar5->emtcxptr[uVar3] = uVar7;
  }
  uVar4 = *(undefined2 *)((long)&n->prsnv + 0x42);
  emtres(ctx->prscxemt,2);
  *(undefined2 *)(ctx->prscxemt->emtcxptr + ctx->prscxemt->emtcxofs) = uVar4;
  goto LAB_0011f9d5;
}

Assistant:

static void prsglval(prscxdef *ctx, int typ, prsndef *n)
{
    uchar op;
    uchar op2;

    if (typ - TOKTINC < sizeof(prsglcvt)/sizeof(prsglcvt[0]))
    {
        op = OPCASI_MASK | prsglcvt[typ - TOKTINC];   /* form basic op code */
        op2 = 0;
    }
    else
    {
        op = OPCASI_MASK | OPCASIEXT;
        op2 = prsglcvt_ext[typ - TOKTMODEQ];
    }
    
    switch(n->prsnnlf)
    {
    case 0:
        {
            int lclnum;
            int styp;

            /* DON'T assume this is a 'self.' property if unknown */
            /* DON'T prsdef(ctx, &n->prsnv.prsnvt, TOKSTPROP); */

            if (n->prsnv.prsnvt.toktyp == TOKTSYMBOL)
            {
                if (ctx->prscxflg & PRSCXFWTCH)
                    errsig(ctx->prscxerr, ERR_WTCHLCL);

                if ((styp = n->prsnv.prsnvt.toksym.tokstyp) == TOKSTLOCAL)
                {
                    emtop(ctx->prscxemt, op | OPCASILCL);
                    if (op2) emtop(ctx->prscxemt, op2);
                    lclnum = n->prsnv.prsnvt.toksym.toksval;
                    emtint2(ctx->prscxemt, lclnum);
                }
                else if (styp == TOKSTPROP)
                {
                    if (ctx->prscxflg & PRSCXFFUNC)
                        errlog(ctx->prscxerr, ERR_NOSELF);
                    
                    emtop(ctx->prscxemt, OPCPUSHSELF);
                    emtop(ctx->prscxemt, op | OPCASIPRP);
                    if (op2) emtop(ctx->prscxemt, op2);
                    lclnum = n->prsnv.prsnvt.toksym.toksval;
                    emtint2(ctx->prscxemt, lclnum);
                }
                else if (styp == TOKSTPROPSPEC)
                    errsig(ctx->prscxerr, ERR_BADSPECEXPR);
                else
                    errlog(ctx->prscxerr, ERR_INVASI);
            }
            else
                errlog(ctx->prscxerr, ERR_INVASI);
        }
        break;
        
    case 2:
        switch(n->prsntyp)
        {
        case TOKTDOT:
            {
                prsndef *n1 = n->prsnv.prsnvn[1];
                int      base_opc;
                int      direct_prop;
                prpnum   prop;
                    
                /* generate the expression providing the object */
                prsgexp(ctx, n->prsnv.prsnvn[0]);

                /* determine the correct base opcode */
                if (n1->prsnnlf == 0 && n1->prsnv.prsnvt.toktyp == TOKTPOUND)
                {

                    /* simple property assignment */
                    direct_prop = TRUE;
                    base_opc = OPCASIPRP;

                    /* remember the property id */
                    prop = n1->prsnv.prsnvt.tokofs;
                }
                else
                {
                    /* assignment through property pointer */
                    direct_prop = FALSE;
                    base_opc = OPCASIPRPPTR;

                    /* generate the property pointer expression */
                    prsgexp(ctx, n1);
                }

                /* generate the appropriate property assignment opcode */
                emtop(ctx->prscxemt, op | base_opc);
                if (op2) emtop(ctx->prscxemt, op2);

                /* if it's a simple assignment, add the property code */
                if (direct_prop) emtint2(ctx->prscxemt, prop);

                break;
            }
            
        case TOKTLBRACK:
            prsgexp(ctx, n->prsnv.prsnvn[0]);             /* evaluate list  */
            prsgexp(ctx, n->prsnv.prsnvn[1]);             /* evaluate index */
            emtop(ctx->prscxemt, op | OPCASIIND);
            if (op2) emtop(ctx->prscxemt, op2);
            prsglval(ctx, TOKTASSIGN, n->prsnv.prsnvn[0]);      /* set list */
            break;
            
        default:
            errlog(ctx->prscxerr, ERR_INVASI);
        }
        break;
        
    default:
        errlog(ctx->prscxerr, ERR_INVASI);
    }
}